

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaLf.c
# Opt level: O0

int Lf_ManDerivePart(Lf_Man_t *p,Gia_Man_t *pNew,Vec_Int_t *vMapping,Vec_Int_t *vMapping2,
                    Vec_Int_t *vCopies,Lf_Cut_t *pCut,Vec_Int_t *vLeaves,Vec_Int_t *vCover,
                    Gia_Obj_t *pObj)

{
  int iVar1;
  int iVar_00;
  int iVar2;
  int Entry;
  int iVar3;
  word *pwVar4;
  int local_5b4;
  int local_4b0;
  int iVar;
  int c;
  int nWords;
  int LutSize;
  int iLitCofs [2];
  int nVarsNew;
  int pVarsNew [13];
  word *pTruth_1;
  word pTruthCof [128];
  int iTemp;
  int iLit;
  int k;
  word *pTruth;
  Lf_Cut_t *pCut_local;
  Vec_Int_t *vCopies_local;
  Vec_Int_t *vMapping2_local;
  Vec_Int_t *vMapping_local;
  Gia_Man_t *pNew_local;
  Lf_Man_t *p_local;
  
  if ((p->pPars->nLutSizeMux == 0) || (p->pPars->nLutSizeMux != *(uint *)&pCut->field_0x14 >> 0x18))
  {
    Vec_IntClear(vLeaves);
    if ((*(uint *)&pCut->field_0x14 >> 0x17 & 1) == 0) {
      for (iTemp = 0; iTemp < (int)(*(uint *)&pCut->field_0x14 >> 0x18); iTemp = iTemp + 1) {
        iVar3 = Vec_IntEntry(vCopies,*(int *)((long)&pCut[1].Sign + (long)iTemp * 4));
        Vec_IntPush(vLeaves,iVar3);
      }
    }
    else {
      if (*(uint *)&pCut->field_0x14 >> 0x18 != 3) {
        __assert_fail("pCut->nLeaves == 3",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaLf.c"
                      ,0x725,
                      "int Lf_ManDerivePart(Lf_Man_t *, Gia_Man_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Lf_Cut_t *, Vec_Int_t *, Vec_Int_t *, Gia_Obj_t *)"
                     );
      }
      iVar3 = Vec_IntEntry(vCopies,(int)pCut[1].Sign);
      iVar1 = Gia_ObjFaninC0(pObj);
      iVar3 = Abc_LitNotCond(iVar3,iVar1);
      Vec_IntPush(vLeaves,iVar3);
      iVar3 = Vec_IntEntry(vCopies,*(int *)((long)&pCut[1].Sign + 4));
      iVar1 = Gia_ObjFaninC1(pObj);
      iVar3 = Abc_LitNotCond(iVar3,iVar1);
      Vec_IntPush(vLeaves,iVar3);
      iVar3 = Vec_IntEntry(vCopies,pCut[1].Delay);
      iVar1 = Gia_ObjFaninC2(p->pGia,pObj);
      iVar3 = Abc_LitNotCond(iVar3,iVar1);
      Vec_IntPush(vLeaves,iVar3);
    }
    pwVar4 = Lf_CutTruth(p,pCut);
    iVar3 = Vec_IntSize(vLeaves);
    p_local._4_4_ = Kit_TruthToGia(pNew,(uint *)pwVar4,iVar3,vCover,vLeaves,0);
    iVar3 = Abc_Lit2Var(p_local._4_4_);
    iVar1 = Vec_IntSize(vMapping2);
    Vec_IntSetEntry(vMapping,iVar3,iVar1);
    iVar3 = Vec_IntSize(vLeaves);
    Vec_IntPush(vMapping2,iVar3);
    for (iTemp = 0; iVar3 = Vec_IntSize(vLeaves), iTemp < iVar3; iTemp = iTemp + 1) {
      pTruthCof[0x7f]._4_4_ = Vec_IntEntry(vLeaves,iTemp);
      iVar3 = Abc_Lit2Var(pTruthCof[0x7f]._4_4_);
      Vec_IntPush(vMapping2,iVar3);
    }
    if ((*(uint *)&pCut->field_0x14 >> 0x17 & 1) == 0) {
      local_5b4 = Abc_Lit2Var(p_local._4_4_);
    }
    else {
      local_5b4 = Abc_Lit2Var(p_local._4_4_);
      local_5b4 = -local_5b4;
    }
    Vec_IntPush(vMapping2,local_5b4);
  }
  else {
    pwVar4 = Lf_CutTruth(p,pCut);
    iVar3 = p->pPars->nLutSize;
    iVar1 = Abc_Truth6WordNum(iVar3);
    iVar_00 = Lf_ManFindCofVar(pwVar4,iVar1,*(uint *)&pCut->field_0x14 >> 0x18);
    if ((iVar_00 < 0) || ((int)(*(uint *)&pCut->field_0x14 >> 0x18) <= iVar_00)) {
      __assert_fail("iVar >= 0 && iVar < (int)pCut->nLeaves",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaLf.c"
                    ,0x6fc,
                    "int Lf_ManDerivePart(Lf_Man_t *, Gia_Man_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Lf_Cut_t *, Vec_Int_t *, Vec_Int_t *, Gia_Obj_t *)"
                   );
    }
    for (local_4b0 = 0; local_4b0 < 2; local_4b0 = local_4b0 + 1) {
      for (iTemp = 0; iTemp < (int)(*(uint *)&pCut->field_0x14 >> 0x18); iTemp = iTemp + 1) {
        iLitCofs[(long)iTemp + 1] = iTemp;
      }
      if (local_4b0 == 0) {
        Abc_TtCofactor0p((word *)&pTruth_1,pwVar4,iVar1,iVar_00);
      }
      else {
        Abc_TtCofactor1p((word *)&pTruth_1,pwVar4,iVar1,iVar_00);
      }
      iLitCofs[0] = Abc_TtMinBase((word *)&pTruth_1,iLitCofs + 1,*(uint *)&pCut->field_0x14 >> 0x18,
                                  iVar3);
      if (iLitCofs[0] < 1) {
        __assert_fail("nVarsNew > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaLf.c"
                      ,0x706,
                      "int Lf_ManDerivePart(Lf_Man_t *, Gia_Man_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Lf_Cut_t *, Vec_Int_t *, Vec_Int_t *, Gia_Obj_t *)"
                     );
      }
      Vec_IntClear(vLeaves);
      for (iTemp = 0; iTemp < iLitCofs[0]; iTemp = iTemp + 1) {
        iVar2 = Vec_IntEntry(vCopies,*(int *)((long)&pCut[1].Sign +
                                             (long)iLitCofs[(long)iTemp + 1] * 4));
        Vec_IntPush(vLeaves,iVar2);
      }
      iVar2 = Kit_TruthToGia(pNew,(uint *)&pTruth_1,iLitCofs[0],vCover,vLeaves,0);
      (&nWords)[local_4b0] = iVar2;
      iVar2 = Abc_Lit2Var((&nWords)[local_4b0]);
      Entry = Vec_IntSize(vMapping2);
      Vec_IntSetEntry(vMapping,iVar2,Entry);
      iVar2 = Vec_IntSize(vLeaves);
      Vec_IntPush(vMapping2,iVar2);
      for (iTemp = 0; iVar2 = Vec_IntSize(vLeaves), iTemp < iVar2; iTemp = iTemp + 1) {
        pTruthCof[0x7f]._4_4_ = Vec_IntEntry(vLeaves,iTemp);
        iVar2 = Abc_Lit2Var(pTruthCof[0x7f]._4_4_);
        Vec_IntPush(vMapping2,iVar2);
      }
      iVar2 = Abc_Lit2Var((&nWords)[local_4b0]);
      Vec_IntPush(vMapping2,iVar2);
    }
    pTruth_1 = (word *)0xcacacacacacacaca;
    Vec_IntClear(vLeaves);
    Vec_IntPush(vLeaves,nWords);
    Vec_IntPush(vLeaves,LutSize);
    iVar3 = Vec_IntEntry(vCopies,*(int *)((long)&pCut[1].Sign + (long)iVar_00 * 4));
    Vec_IntPush(vLeaves,iVar3);
    iVar3 = Vec_IntSize(vLeaves);
    p_local._4_4_ = Kit_TruthToGia(pNew,(uint *)&pTruth_1,iVar3,vCover,vLeaves,0);
    iVar3 = Abc_Lit2Var(p_local._4_4_);
    iVar1 = Vec_IntSize(vMapping2);
    Vec_IntSetEntry(vMapping,iVar3,iVar1);
    iVar3 = Vec_IntSize(vLeaves);
    Vec_IntPush(vMapping2,iVar3);
    for (iTemp = 0; iVar3 = Vec_IntSize(vLeaves), iTemp < iVar3; iTemp = iTemp + 1) {
      pTruthCof[0x7f]._4_4_ = Vec_IntEntry(vLeaves,iTemp);
      iVar3 = Abc_Lit2Var(pTruthCof[0x7f]._4_4_);
      Vec_IntPush(vMapping2,iVar3);
    }
    iVar3 = Abc_Lit2Var(p_local._4_4_);
    Vec_IntPush(vMapping2,-iVar3);
  }
  return p_local._4_4_;
}

Assistant:

static inline int Lf_ManDerivePart( Lf_Man_t * p, Gia_Man_t * pNew, Vec_Int_t * vMapping, Vec_Int_t * vMapping2, Vec_Int_t * vCopies, Lf_Cut_t * pCut, Vec_Int_t * vLeaves, Vec_Int_t * vCover, Gia_Obj_t * pObj )
{
    word * pTruth;
    int k, iLit, iTemp;
    if ( p->pPars->nLutSizeMux && p->pPars->nLutSizeMux == (int)pCut->nLeaves )
    {
        word pTruthCof[LF_TT_WORDS], * pTruth = Lf_CutTruth( p, pCut );
        int pVarsNew[LF_LEAF_MAX], nVarsNew, iLitCofs[2]; 
        int LutSize   = p->pPars->nLutSize;
        int nWords    = Abc_Truth6WordNum(LutSize);
        int c, iVar   = Lf_ManFindCofVar( pTruth, nWords, pCut->nLeaves );
        assert( iVar >= 0 && iVar < (int)pCut->nLeaves );
        for ( c = 0; c < 2; c++ )
        {
            for ( k = 0; k < (int)pCut->nLeaves; k++ )
                pVarsNew[k] = k;
            if ( c )
                Abc_TtCofactor1p( pTruthCof, pTruth, nWords, iVar );
            else
                Abc_TtCofactor0p( pTruthCof, pTruth, nWords, iVar );
            nVarsNew = Abc_TtMinBase( pTruthCof, pVarsNew, pCut->nLeaves, LutSize );
            assert( nVarsNew > 0 );
            // derive LUT
            Vec_IntClear( vLeaves );
            for ( k = 0; k < nVarsNew; k++ )
                Vec_IntPush( vLeaves, Vec_IntEntry(vCopies, pCut->pLeaves[pVarsNew[k]]) );
            iLitCofs[c] = Kit_TruthToGia( pNew, (unsigned *)pTruthCof, nVarsNew, vCover, vLeaves, 0 );
            // create mapping
            Vec_IntSetEntry( vMapping, Abc_Lit2Var(iLitCofs[c]), Vec_IntSize(vMapping2) );
            Vec_IntPush( vMapping2, Vec_IntSize(vLeaves) );
            Vec_IntForEachEntry( vLeaves, iTemp, k )
                Vec_IntPush( vMapping2, Abc_Lit2Var(iTemp) );
            Vec_IntPush( vMapping2, Abc_Lit2Var(iLitCofs[c]) );
        }
        // derive MUX
        pTruthCof[0] = ABC_CONST(0xCACACACACACACACA);
        Vec_IntClear( vLeaves );
        Vec_IntPush( vLeaves, iLitCofs[0] );
        Vec_IntPush( vLeaves, iLitCofs[1] );
        Vec_IntPush( vLeaves, Vec_IntEntry(vCopies, pCut->pLeaves[iVar]) );
        iLit = Kit_TruthToGia( pNew, (unsigned *)pTruthCof, Vec_IntSize(vLeaves), vCover, vLeaves, 0 );
        // create mapping
        Vec_IntSetEntry( vMapping, Abc_Lit2Var(iLit), Vec_IntSize(vMapping2) );
        Vec_IntPush( vMapping2, Vec_IntSize(vLeaves) );
        Vec_IntForEachEntry( vLeaves, iTemp, k )
            Vec_IntPush( vMapping2, Abc_Lit2Var(iTemp) );
        Vec_IntPush( vMapping2, -Abc_Lit2Var(iLit) );
        return iLit;
    }
    Vec_IntClear( vLeaves );
    if ( pCut->fMux7 )
    {
        assert( pCut->nLeaves == 3 );
        Vec_IntPush( vLeaves, Abc_LitNotCond(Vec_IntEntry(vCopies, pCut->pLeaves[0]), Gia_ObjFaninC0(pObj)) );
        Vec_IntPush( vLeaves, Abc_LitNotCond(Vec_IntEntry(vCopies, pCut->pLeaves[1]), Gia_ObjFaninC1(pObj)) );
        Vec_IntPush( vLeaves, Abc_LitNotCond(Vec_IntEntry(vCopies, pCut->pLeaves[2]), Gia_ObjFaninC2(p->pGia,pObj)) );
    }
    else
    {
        for ( k = 0; k < (int)pCut->nLeaves; k++ )
            Vec_IntPush( vLeaves, Vec_IntEntry(vCopies, pCut->pLeaves[k]) );
    }
    pTruth = Lf_CutTruth( p, pCut );
    iLit = Kit_TruthToGia( pNew, (unsigned *)pTruth, Vec_IntSize(vLeaves), vCover, vLeaves, 0 );
    // create mapping
    Vec_IntSetEntry( vMapping, Abc_Lit2Var(iLit), Vec_IntSize(vMapping2) );
    Vec_IntPush( vMapping2, Vec_IntSize(vLeaves) );
    Vec_IntForEachEntry( vLeaves, iTemp, k )
        Vec_IntPush( vMapping2, Abc_Lit2Var(iTemp) );
    Vec_IntPush( vMapping2, pCut->fMux7 ? -Abc_Lit2Var(iLit) : Abc_Lit2Var(iLit) );
    return iLit;
}